

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O3

QVariant * __thiscall
QSpinBoxPrivate::validateAndInterpret
          (QVariant *__return_storage_ptr__,QSpinBoxPrivate *this,QString *input,int *pos,
          State *state)

{
  QLocale *pQVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  undefined1 *puVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  State SVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  QVariant *this_00;
  long in_FS_OFFSET;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QLatin1String QVar20;
  QLatin1String QVar21;
  bool ok;
  QStringBuilder<const_QString_&,_const_QString_&> local_b0;
  storage_type_conflict *psStack_a0;
  QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_QString_&> local_98;
  bool local_79;
  QString local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar10 = (this->super_QAbstractSpinBoxPrivate).cachedText.d.size;
  if (((lVar10 == (input->d).size) &&
      (QVar13.m_data = (this->super_QAbstractSpinBoxPrivate).cachedText.d.ptr,
      QVar13.m_size = lVar10, QVar19.m_data = (input->d).ptr, QVar19.m_size = lVar10,
      cVar5 = QtPrivate::equalStrings(QVar13,QVar19), lVar10 != 0)) && (cVar5 != '\0')) {
    *state = (this->super_QAbstractSpinBoxPrivate).cachedState;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      ::QVariant::QVariant
                (__return_storage_ptr__,&(this->super_QAbstractSpinBoxPrivate).cachedValue);
      return __return_storage_ptr__;
    }
    goto LAB_0047e408;
  }
  iVar6 = ::QVariant::toInt((bool *)&(this->super_QAbstractSpinBoxPrivate).maximum);
  iVar7 = ::QVariant::toInt((bool *)&(this->super_QAbstractSpinBoxPrivate).minimum);
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractSpinBoxPrivate::stripped(&local_78,&this->super_QAbstractSpinBoxPrivate,input,pos);
  pcVar3 = local_78.d.ptr;
  *state = Acceptable;
  if (iVar6 == iVar7) {
LAB_0047dfc9:
    cVar5 = QString::startsWith((QChar)(char16_t)&local_78,0x2d);
    if ((iVar7 < 0) || (SVar9 = Invalid, cVar5 == '\0')) goto LAB_0047dff0;
LAB_0047e24e:
    *state = SVar9;
LAB_0047e255:
    if (iVar6 < 1) {
      iVar7 = iVar6;
    }
  }
  else {
    SVar9 = Intermediate;
    if ((storage_type_conflict *)local_78.d.size == (storage_type_conflict *)0x0) goto LAB_0047e24e;
    if ((storage_type_conflict *)local_78.d.size != (storage_type_conflict *)0x1 || -1 < iVar7) {
      if (-1 < iVar6 && (storage_type_conflict *)local_78.d.size == (storage_type_conflict *)0x1) {
LAB_0047e22d:
        QVar17.m_data = pcVar3;
        QVar17.m_size = 1;
        QVar21.m_data = "+";
        QVar21.m_size = 1;
        cVar5 = QtPrivate::equalStrings(QVar17,QVar21);
        if (cVar5 != '\0') goto LAB_0047e24e;
      }
      goto LAB_0047dfc9;
    }
    QVar15.m_data = local_78.d.ptr;
    QVar15.m_size = 1;
    QVar20.m_data = "-";
    QVar20.m_size = 1;
    cVar5 = QtPrivate::equalStrings(QVar15,QVar20);
    if (cVar5 != '\0') goto LAB_0047e24e;
    if (-1 < iVar6) goto LAB_0047e22d;
    QString::startsWith((QChar)(char16_t)&local_78,0x2d);
LAB_0047dff0:
    local_79 = false;
    iVar12 = *(int *)&(this->super_QAbstractSpinBoxPrivate).field_0x3d4;
    if (iVar12 == 10) {
      pQVar1 = &(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate.locale;
      QVar14.m_data = (storage_type_conflict *)local_78.d.size;
      QVar14.m_size = (qsizetype)pQVar1;
      uVar8 = QLocale::toInt(QVar14,(bool *)local_78.d.ptr);
      uVar11 = (ulong)uVar8;
      if ((local_79 == false) && (999 < iVar6 || iVar7 < -999)) {
        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QLocale::groupSeparator();
        local_98.b = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.a.a = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.a.b = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        local_b0.a = (QString *)&local_58;
        local_b0.b = (QString *)&local_58;
        QStringBuilder<const_QString_&,_const_QString_&>::convertTo<QString>
                  ((QString *)&local_98,&local_b0);
        lVar10 = QString::indexOf((QString *)&local_78,(longlong)&local_58,CaseInsensitive);
        if ((lVar10 != -1) &&
           (lVar10 = QString::indexOf((QString *)&local_78,(longlong)&local_98,CaseInsensitive),
           lVar10 == -1)) {
          local_b0.a = (QString *)local_78.d.d;
          local_b0.b = (QString *)local_78.d.ptr;
          psStack_a0 = (storage_type_conflict *)local_78.d.size;
          if ((anon_union_24_3_e3d07ef4_for_data *)local_78.d.d !=
              (anon_union_24_3_e3d07ef4_for_data *)0x0) {
            LOCK();
            *(int *)local_78.d.d = *(int *)local_78.d.d + 1;
            UNLOCK();
          }
          QString::remove((QString *)&local_b0,(CaseSensitivity)&local_58);
          QVar18.m_data = psStack_a0;
          QVar18.m_size = (qsizetype)pQVar1;
          uVar8 = QLocale::toInt(QVar18,(bool *)local_b0.b);
          uVar11 = (ulong)uVar8;
          if ((anon_union_24_3_e3d07ef4_for_data *)local_b0.a !=
              (anon_union_24_3_e3d07ef4_for_data *)0x0) {
            LOCK();
            *(int *)local_b0.a = *(int *)local_b0.a + -1;
            UNLOCK();
            if (*(int *)local_b0.a == 0) {
              QArrayData::deallocate((QArrayData *)local_b0.a,2,0x10);
            }
          }
        }
        if ((QArrayData *)local_98.a.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_98.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_98.a.a)->d)->_q_value).super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_98.a.a)->d)->_q_value).super___atomic_base<int>._M_i == 0
             ) {
            QArrayData::deallocate((QArrayData *)local_98.a.a,2,0x10);
          }
        }
        if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_58.shared = *(int *)local_58.shared + -1;
          UNLOCK();
          if (*(int *)local_58.shared == 0) {
            QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
          }
        }
      }
    }
    else {
      QVar16.m_data = local_78.d.ptr;
      QVar16.m_size = local_78.d.size;
      uVar11 = QString::toIntegral_helper(QVar16,&local_79,iVar12);
      if ((long)(int)uVar11 != uVar11) {
        local_79 = false;
        uVar11 = 0;
      }
    }
    iVar12 = (int)uVar11;
    SVar9 = Invalid;
    if (local_79 != true) {
LAB_0047e20c:
      *state = SVar9;
      goto LAB_0047e255;
    }
    if (iVar12 < iVar7 || iVar6 < iVar12) {
      SVar9 = Invalid;
      if (iVar6 != iVar7) {
        SVar9 = (State)((-1 < iVar12 || iVar7 <= iVar12) && (-1 >= iVar12 || iVar12 <= iVar6));
      }
      goto LAB_0047e20c;
    }
    *state = Acceptable;
    iVar7 = iVar12;
  }
  local_98.a.a = &(this->super_QAbstractSpinBoxPrivate).prefix;
  local_98.b = &(this->super_QAbstractSpinBoxPrivate).suffix;
  local_98.a.b = &local_78;
  QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_QString_&>::convertTo<QString>
            ((QString *)&local_58,&local_98);
  pQVar2 = &((input->d).d)->super_QArrayData;
  pcVar3 = (input->d).ptr;
  (input->d).d = (Data *)local_58.shared;
  (input->d).ptr = (char16_t *)local_58._8_8_;
  puVar4 = (undefined1 *)(input->d).size;
  (input->d).size = local_58._16_8_;
  local_58.shared = (PrivateShared *)pQVar2;
  local_58._8_8_ = pcVar3;
  local_58._16_8_ = puVar4;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  QString::operator=(&(this->super_QAbstractSpinBoxPrivate).cachedText,(QString *)input);
  (this->super_QAbstractSpinBoxPrivate).cachedState = *state;
  ::QVariant::QVariant((QVariant *)&local_58,iVar7);
  this_00 = &(this->super_QAbstractSpinBoxPrivate).cachedValue;
  ::QVariant::operator=(this_00,(QVariant *)&local_58);
  ::QVariant::~QVariant((QVariant *)&local_58);
  ::QVariant::QVariant(__return_storage_ptr__,this_00);
  if ((anon_union_24_3_e3d07ef4_for_data *)local_78.d.d != (anon_union_24_3_e3d07ef4_for_data *)0x0)
  {
    LOCK();
    *(int *)local_78.d.d = *(int *)local_78.d.d + -1;
    UNLOCK();
    if (*(int *)local_78.d.d == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0047e408:
  __stack_chk_fail();
}

Assistant:

QVariant QSpinBoxPrivate::validateAndInterpret(QString &input, int &pos,
                                               QValidator::State &state) const
{
    if (cachedText == input && !input.isEmpty()) {
        state = cachedState;
        QSBDEBUG() << "cachedText was '" << cachedText << "' state was "
                   << state << " and value was " << cachedValue;

        return cachedValue;
    }
    const int max = maximum.toInt();
    const int min = minimum.toInt();

    QString copy = stripped(input, &pos);
    QSBDEBUG() << "input" << input << "copy" << copy;
    state = QValidator::Acceptable;
    int num = min;

    if (max != min && (copy.isEmpty()
                       || (min < 0 && copy == "-"_L1)
                       || (max >= 0 && copy == "+"_L1))) {
        state = QValidator::Intermediate;
        QSBDEBUG() << __FILE__ << __LINE__<< "num is set to" << num;
    } else if (copy.startsWith(u'-') && min >= 0) {
        state = QValidator::Invalid; // special-case -0 will be interpreted as 0 and thus not be invalid with a range from 0-100
    } else {
        bool ok = false;
        if (displayIntegerBase != 10) {
            num = copy.toInt(&ok, displayIntegerBase);
        } else {
            num = locale.toInt(copy, &ok);
            if (!ok && (max >= 1000 || min <= -1000)) {
                const QString sep(locale.groupSeparator());
                const QString doubleSep = sep + sep;
                if (copy.contains(sep) && !copy.contains(doubleSep)) {
                    QString copy2 = copy;
                    copy2.remove(sep);
                    num = locale.toInt(copy2, &ok);
                }
            }
        }
        QSBDEBUG() << __FILE__ << __LINE__<< "num is set to" << num;
        if (!ok) {
            state = QValidator::Invalid;
        } else if (num >= min && num <= max) {
            state = QValidator::Acceptable;
        } else if (max == min) {
            state = QValidator::Invalid;
        } else {
            if ((num >= 0 && num > max) || (num < 0 && num < min)) {
                state = QValidator::Invalid;
                QSBDEBUG() << __FILE__ << __LINE__<< "state is set to Invalid";
            } else {
                state = QValidator::Intermediate;
                QSBDEBUG() << __FILE__ << __LINE__<< "state is set to Intermediate";
            }
        }
    }
    if (state != QValidator::Acceptable)
        num = max > 0 ? min : max;
    input = prefix + copy + suffix;
    cachedText = input;
    cachedState = state;
    cachedValue = QVariant((int)num);

    QSBDEBUG() << "cachedText is set to '" << cachedText << "' state is set to "
               << state << " and value is set to " << cachedValue;
    return cachedValue;
}